

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeInitializationTest.cpp
# Opt level: O0

EStatusCode
ShowFaceProperties(FreeTypeWrapper *inFreeType,string *inFontFilePath,
                  string *inSecondaryFontFilePath)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  EStatusCode local_2c;
  FT_Face pFStack_28;
  EStatusCode status;
  FT_Face face;
  string *inSecondaryFontFilePath_local;
  string *inFontFilePath_local;
  FreeTypeWrapper *inFreeType_local;
  
  std::operator<<((ostream *)&std::cout,"Start Font\n");
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    pFStack_28 = FreeTypeWrapper::NewFace(inFreeType,inFontFilePath,0);
  }
  else {
    pFStack_28 = FreeTypeWrapper::NewFace(inFreeType,inFontFilePath,inSecondaryFontFilePath,0);
  }
  if (pFStack_28 == (FT_Face)0x0) {
    local_2c = eFailure;
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed to load font from ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\n");
  }
  else {
    local_2c = ShowGlobalFontProperties(inFreeType,pFStack_28);
  }
  FreeTypeWrapper::DoneFace(inFreeType,pFStack_28);
  std::operator<<((ostream *)&std::cout,"End Font\n\n");
  return local_2c;
}

Assistant:

static EStatusCode ShowFaceProperties(FreeTypeWrapper& inFreeType,const string& inFontFilePath,const string& inSecondaryFontFilePath = "")
{
	FT_Face face;
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		cout<<"Start Font\n";
		if(inSecondaryFontFilePath.length() > 0)
			face = inFreeType.NewFace(inFontFilePath,inSecondaryFontFilePath,0);
		else
			face = inFreeType.NewFace(inFontFilePath,0);
		if(!face)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to load font from "<<inFontFilePath.c_str()<<"\n";
			break;
		}
		status = ShowGlobalFontProperties(inFreeType,face);
	}
	while(false);

	inFreeType.DoneFace(face);
	cout<<"End Font\n\n";
	return status;
}